

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger64
          (Parser *this,uint64 max_value,uint64 *output,char *error)

{
  char *__s;
  bool bVar1;
  Token *pTVar2;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *error_local;
  uint64 *output_local;
  uint64 max_value_local;
  Parser *this_local;
  
  local_30 = error;
  error_local = (char *)output;
  output_local = (uint64 *)max_value;
  max_value_local = (uint64)this;
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  __s = local_30;
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,(uint64)output_local,(uint64 *)error_local);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Integer out of range.",&local_51);
      AddError(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      error_local[0] = '\0';
      error_local[1] = '\0';
      error_local[2] = '\0';
      error_local[3] = '\0';
      error_local[4] = '\0';
      error_local[5] = '\0';
      error_local[6] = '\0';
      error_local[7] = '\0';
    }
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
    AddError(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeInteger64(uint64 max_value, uint64* output,
                              const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    if (!io::Tokenizer::ParseInteger(input_->current().text, max_value,
                                     output)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
      *output = 0;
    }
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}